

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall pbrt::BasicSceneBuilder::GraphicsState::GraphicsState(GraphicsState *this)

{
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *this_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *this_01;
  string *in_RDI;
  ParameterDictionary *in_stack_ffffffffffffff40;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_40;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_38;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_30;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_28;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_20 [4];
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  *(undefined4 *)(in_RDI + 0x40) = 0;
  std::__cxx11::string::string(in_RDI + 0x48);
  std::__cxx11::string::string(in_RDI + 0x68);
  ParameterDictionary::ParameterDictionary(in_stack_ffffffffffffff40);
  FileLoc::FileLoc((FileLoc *)in_stack_ffffffffffffff40);
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::ParsedParameter_*> *)in_stack_ffffffffffffff40);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)(in_RDI + 0x110),local_20);
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::ParsedParameter_*> *)in_stack_ffffffffffffff40);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)(in_RDI + 0x170),&local_28);
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::ParsedParameter_*> *)in_stack_ffffffffffffff40);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)(in_RDI + 0x1d0),&local_30);
  this_00 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             *)(in_RDI + 0x230);
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::ParsedParameter_*> *)in_stack_ffffffffffffff40);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(this_00,&local_38);
  this_01 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             *)(in_RDI + 0x290);
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::ParsedParameter_*> *)this_01);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(this_01,&local_40);
  in_RDI[0x2f0] = (string)0x0;
  *(undefined8 *)(in_RDI + 0x2f8) = RGBColorSpace::sRGB;
  TransformSet::TransformSet((TransformSet *)this_00);
  *(undefined4 *)(in_RDI + 0x400) = 3;
  *(undefined4 *)(in_RDI + 0x404) = 0;
  *(undefined4 *)(in_RDI + 0x408) = 0x3f800000;
  *(undefined4 *)(in_RDI + 0x40) = 0;
  return;
}

Assistant:

BasicSceneBuilder::GraphicsState::GraphicsState() {
    currentMaterialIndex = 0;
}